

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O1

vec3 golf_config_get_vec3(golf_config_t *cfg,char *name)

{
  golf_config_property_t *pgVar1;
  vec3 vVar2;
  
  pgVar1 = (golf_config_property_t *)map_get_((map_base_t *)cfg,name);
  (cfg->properties).ref = pgVar1;
  if ((pgVar1 == (golf_config_property_t *)0x0) || (pgVar1->type != GOLF_CONFIG_PROPERTY_VEC3)) {
    golf_log_warning("Invalid config property %s",name);
    vVar2 = vec3_create(0.0,0.0,0.0);
  }
  else {
    vVar2 = (pgVar1->field_1).vec3_val;
  }
  return vVar2;
}

Assistant:

vec3 golf_config_get_vec3(golf_config_t *cfg, const char *name) {
    golf_config_property_t *prop = map_get(&cfg->properties, name);
    if (prop && prop->type == GOLF_CONFIG_PROPERTY_VEC3) {
        return prop->vec3_val;
    }
    else {
        golf_log_warning("Invalid config property %s", name);
        return V3(0, 0, 0);
    }
}